

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQObject __thiscall SQFuncState::CreateString(SQFuncState *this,SQChar *s,SQInteger len)

{
  SQObject SVar1;
  SQString *x;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr ns;
  SQChar *in_stack_ffffffffffffff98;
  SQSharedState *in_stack_ffffffffffffffa0;
  SQObjectPtr local_50;
  SQObjectType local_40;
  SQObjectFlags SStack_3c;
  undefined3 uStack_3b;
  SQObjectValue in_stack_ffffffffffffffc8;
  
  x = SQString::Create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(SQInteger)in_RDI);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,x);
  ::SQObjectPtr::SQObjectPtr(&local_50,1);
  SQTable::NewSlot(in_RSI,in_RDX,(SQObjectPtr *)in_stack_ffffffffffffffc8.pTable);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  SVar1._unVal.pTable = in_stack_ffffffffffffffc8.pTable;
  SVar1._type = local_40;
  SVar1._flags = SStack_3c;
  SVar1._5_3_ = uStack_3b;
  return SVar1;
}

Assistant:

SQObject SQFuncState::CreateString(const SQChar *s,SQInteger len)
{
    SQObjectPtr ns(SQString::Create(_sharedstate,s,len));
    _table(_strings)->NewSlot(ns,(SQInteger)1);
    return ns;
}